

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O2

sgr_ostream_wrapper * __thiscall
cpp_sgr::sgr_ostream_wrapper::operator<<(sgr_ostream_wrapper *this,sgr *c)

{
  string local_30;
  
  sgr::toString_abi_cxx11_(&local_30,c);
  std::operator<<(&this->stream,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

sgr_ostream_wrapper & sgr_ostream_wrapper::operator<<(const sgr & c)
	{
		stream << c.toString();
		return *this;
	}